

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network4.c
# Opt level: O3

int net_tcp4_nonblock_socket(void)

{
  int __fd;
  uint uVar1;
  int iVar2;
  int iVar3;
  
  __fd = socket(2,1,0);
  iVar3 = -1;
  if (__fd != -1) {
    uVar1 = fcntl(__fd,3,0);
    iVar2 = fcntl(__fd,4,(ulong)(uVar1 | 0x800));
    iVar3 = __fd;
    if (iVar2 == -1) {
      close(__fd);
      iVar3 = -1;
    }
  }
  return iVar3;
}

Assistant:

int net_tcp4_nonblock_socket(void) {
  int s;

  s = socket(AF_INET, SOCK_STREAM, 0);
  if (s == -1)
    return -1;
  if (net_tcp4_socket_nonblock(s) == -1) {
    close(s);
    return -1;
  }
  
  return s;
}